

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O2

mbedtls_mpi_uint
mbedtls_mpi_core_add_if(mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,size_t limbs,uint cond)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  for (sVar2 = 0; limbs != sVar2; sVar2 = sVar2 + 1) {
    uVar4 = A[sVar2] & (long)(-(ulong)cond | (ulong)cond) >> 0x3f;
    uVar1 = uVar3 + X[sVar2];
    uVar3 = (ulong)CARRY8(uVar4,uVar1) + (ulong)CARRY8(uVar3,X[sVar2]);
    X[sVar2] = uVar4 + uVar1;
  }
  return uVar3;
}

Assistant:

mbedtls_mpi_uint mbedtls_mpi_core_add_if(mbedtls_mpi_uint *X,
                                         const mbedtls_mpi_uint *A,
                                         size_t limbs,
                                         unsigned cond)
{
    mbedtls_mpi_uint c = 0;

    mbedtls_ct_condition_t do_add = mbedtls_ct_bool(cond);

    for (size_t i = 0; i < limbs; i++) {
        mbedtls_mpi_uint add = mbedtls_ct_mpi_uint_if_else_0(do_add, A[i]);
        mbedtls_mpi_uint t = c + X[i];
        c = (t < X[i]);
        t += add;
        c += (t < add);
        X[i] = t;
    }

    return c;
}